

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int get_search_init_depth
              (int mi_width,int mi_height,int is_inter,SPEED_FEATURES *sf,int tx_size_search_method)

{
  int local_24;
  int local_20;
  int tx_size_search_method_local;
  SPEED_FEATURES *sf_local;
  int is_inter_local;
  int mi_height_local;
  int mi_width_local;
  int local_4;
  
  if (tx_size_search_method == 2) {
    local_4 = 2;
  }
  else if (((sf->tx_sf).tx_size_search_lgr_block == 0) || ((mi_width < 0x11 && (mi_height < 0x11))))
  {
    if (is_inter == 0) {
      if (mi_height == mi_width) {
        local_24 = (sf->tx_sf).intra_tx_size_search_init_depth_sqr;
      }
      else {
        local_24 = (sf->tx_sf).intra_tx_size_search_init_depth_rect;
      }
      local_4 = local_24;
    }
    else {
      if (mi_height == mi_width) {
        local_20 = (sf->tx_sf).inter_tx_size_search_init_depth_sqr;
      }
      else {
        local_20 = (sf->tx_sf).inter_tx_size_search_init_depth_rect;
      }
      local_4 = local_20;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int get_search_init_depth(int mi_width, int mi_height, int is_inter,
                                 const SPEED_FEATURES *sf,
                                 int tx_size_search_method) {
  if (tx_size_search_method == USE_LARGESTALL) return MAX_VARTX_DEPTH;

  if (sf->tx_sf.tx_size_search_lgr_block) {
    if (mi_width > mi_size_wide[BLOCK_64X64] ||
        mi_height > mi_size_high[BLOCK_64X64])
      return MAX_VARTX_DEPTH;
  }

  if (is_inter) {
    return (mi_height != mi_width)
               ? sf->tx_sf.inter_tx_size_search_init_depth_rect
               : sf->tx_sf.inter_tx_size_search_init_depth_sqr;
  } else {
    return (mi_height != mi_width)
               ? sf->tx_sf.intra_tx_size_search_init_depth_rect
               : sf->tx_sf.intra_tx_size_search_init_depth_sqr;
  }
}